

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O0

void gimage::extractContours
               (vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *pl,ImageU8 *image,
               float tolerance)

{
  store_t sVar1;
  bool bVar2;
  long lVar3;
  uchar *puVar4;
  ImageU8 *mask_00;
  ImageU8 *image_00;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  float in_XMM0_Da;
  Polygon p;
  long x;
  bool inside;
  long y;
  ImageU8 mask;
  long i;
  long k;
  uint8_t fg;
  int in_stack_ffffffffffffff0c;
  undefined2 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff12;
  undefined1 in_stack_ffffffffffffff13;
  undefined1 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff15;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  long in_stack_ffffffffffffff18;
  value_type *__x;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffff20;
  long lVar5;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffff30;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *p_00;
  value_type *local_90;
  long local_80;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_68;
  store_t local_29;
  long local_28;
  long local_20;
  uchar local_15;
  
  local_15 = '\0';
  for (local_20 = 0; lVar5 = local_20,
      lVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RSI),
      lVar5 < lVar3; local_20 = local_20 + 1) {
    for (local_28 = 0; lVar5 = local_28,
        lVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RSI),
        lVar5 < lVar3; local_28 = local_28 + 1) {
      local_29 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                           (in_RSI,local_28,local_20,0);
      puVar4 = std::max<unsigned_char>(&local_15,&local_29);
      local_15 = *puVar4;
    }
  }
  mask_00 = (ImageU8 *)Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RSI);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RSI);
  p_00 = &local_68;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,
                               CONCAT15(in_stack_ffffffffffffff15,
                                        CONCAT14(in_stack_ffffffffffffff14,
                                                 CONCAT13(in_stack_ffffffffffffff13,
                                                          CONCAT12(in_stack_ffffffffffffff12,
                                                                   in_stack_ffffffffffffff10)))))),
             in_stack_ffffffffffffff0c);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::clear(in_stack_ffffffffffffff30);
  local_80 = 0;
  while (lVar5 = local_80,
        image_00 = (ImageU8 *)
                   Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RSI),
        lVar5 < (long)image_00) {
    bVar2 = false;
    local_90 = (value_type *)0x0;
    while (__x = local_90,
          in_stack_ffffffffffffff20 =
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RSI),
          (long)__x < (long)in_stack_ffffffffffffff20) {
      Polygon::Polygon((Polygon *)0x189087);
      sVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                        (in_RSI,(long)local_90,local_80,0);
      if ((sVar1 != local_15) || (bVar2)) {
        sVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                          (in_RSI,(long)local_90,local_80,0);
        if ((sVar1 != local_15) && (bVar2)) {
          sVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                            (&local_68,
                             (long)((long)&local_90[-1].vertex.
                                           super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                             local_80,0);
          if (sVar1 == '\0') {
            extractContour((Polygon *)p_00,mask_00,image_00,lVar5,(long)in_stack_ffffffffffffff20,
                           (int)((ulong)__x >> 0x20));
            bVar2 = Polygon::isClosed((Polygon *)image_00,(float)((ulong)lVar5 >> 0x20));
            if (bVar2) {
              if (0.0 <= in_XMM0_Da) {
                Polygon::reduce((Polygon *)in_RSI,in_XMM0_Da);
              }
              std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::push_back
                        ((vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *)
                         in_stack_ffffffffffffff20,__x);
            }
          }
          bVar2 = false;
        }
      }
      else {
        sVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                          (&local_68,(long)local_90,local_80,0);
        if (sVar1 == '\0') {
          extractContour((Polygon *)p_00,mask_00,image_00,lVar5,(long)in_stack_ffffffffffffff20,
                         (int)((ulong)__x >> 0x20));
          bVar2 = Polygon::isClosed((Polygon *)image_00,(float)((ulong)lVar5 >> 0x20));
          if (bVar2) {
            if (0.0 <= in_XMM0_Da) {
              Polygon::reduce((Polygon *)in_RSI,in_XMM0_Da);
            }
            std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::push_back
                      ((vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *)
                       in_stack_ffffffffffffff20,__x);
          }
        }
        bVar2 = true;
      }
      Polygon::~Polygon((Polygon *)0x1892dd);
      local_90 = (value_type *)
                 ((long)&(local_90->vertex).
                         super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    local_80 = local_80 + 1;
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(in_stack_ffffffffffffff20);
  return;
}

Assistant:

void extractContours(std::vector<Polygon> &pl, const ImageU8 &image, float tolerance)
{
  uint8_t fg=0;

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      fg=std::max(fg, image.get(i, k));
    }
  }

  ImageU8 mask(image.getWidth(), image.getHeight(), 1);
  mask.clear();

  for (long y=0; y<image.getHeight(); y++)
  {
    bool inside=false;
    for (long x=0; x<image.getWidth(); x++)
    {
      Polygon p;

      if (image.get(x, y) == fg && !inside)
      {
        if (mask.get(x, y) == 0)
        {
          extractContour(p, mask, image, x, y, 0);

          if (p.isClosed())
          {
            if (tolerance >= 0)
            {
              p.reduce(tolerance);
            }

            pl.push_back(p);
          }
        }

        inside=true;
      }
      else if (image.get(x, y) != fg && inside)
      {
        if (mask.get(x-1, y) == 0)
        {
          extractContour(p, mask, image, x-1, y, 4);

          if (p.isClosed())
          {
            if (tolerance >= 0)
            {
              p.reduce(tolerance);
            }

            pl.push_back(p);
          }
        }

        inside=false;
      }
    }
  }
}